

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O3

vector<cali::StringConverter,_std::allocator<cali::StringConverter>_> * __thiscall
cali::StringConverter::rec_list
          (vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>
           *__return_storage_ptr__,StringConverter *this,bool *okptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar5;
  byte bVar6;
  char *separators;
  string str;
  istringstream is;
  string local_208;
  undefined8 local_1e8;
  vector<cali::StringConverter,_std::allocator<cali::StringConverter>_> *local_1e0;
  char *local_1d8;
  long local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  bool *local_1b8;
  long local_1b0 [4];
  int aiStack_190 [22];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)this,_S_in);
  cVar3 = util::read_char((istream *)local_1b0);
  if ((cVar3 != '[') && (*(int *)((long)aiStack_190 + *(long *)(local_1b0[0] + -0x18)) == 0)) {
    std::istream::unget();
  }
  paVar1 = &local_208.field_2;
  local_1e8 = 0;
  local_1b8 = okptr;
  do {
    cVar4 = util::read_char((istream *)local_1b0);
    separators = &local_1c8;
    local_1d0 = 0;
    local_1c8 = '\0';
    local_1d8 = separators;
    if (cVar4 == '[') {
      cVar4 = '\x01';
      std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,0x2267e3);
      util::read_nested_text_abi_cxx11_(&local_208,(util *)local_1b0,(istream *)0x5b,']',cVar4);
      std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      cVar4 = util::read_char((istream *)local_1b0);
      uVar5 = extraout_var_00;
      if (cVar4 == ']') goto LAB_0018fa22;
LAB_0018fa9b:
      local_1e8 = CONCAT71(uVar5,1);
      bVar2 = false;
    }
    else {
      if (cVar4 == '{') {
        cVar4 = '\x01';
        std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,0x226721);
        util::read_nested_text_abi_cxx11_(&local_208,(util *)local_1b0,(istream *)0x7b,'}',cVar4);
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_208._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        cVar4 = util::read_char((istream *)local_1b0);
        uVar5 = extraout_var;
        if (cVar4 != '}') goto LAB_0018fa9b;
LAB_0018fa22:
        std::__cxx11::string::append((char *)&local_1d8);
      }
      else {
        std::istream::unget();
        util::read_word_abi_cxx11_(&local_208,(util *)local_1b0,(istream *)",]",separators);
        std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_1d0 != 0) {
        local_208._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_1d8,local_1d8 + local_1d0);
        std::vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>::
        emplace_back<cali::StringConverter>(local_1e0,(StringConverter *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      cVar4 = util::read_char((istream *)local_1b0);
      bVar2 = true;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
    }
    if (((!bVar2) || (*(int *)((long)aiStack_190 + *(long *)(local_1b0[0] + -0x18)) != 0)) ||
       (cVar4 != ',')) {
      if (cVar3 == '[') {
        bVar6 = 1;
        if (cVar4 == ']') {
          bVar6 = (byte)local_1e8;
        }
      }
      else {
        std::istream::unget();
        bVar6 = (byte)local_1e8;
      }
      if (local_1b8 != (bool *)0x0) {
        *local_1b8 = (bool)(~bVar6 & 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      return local_1e0;
    }
  } while( true );
}

Assistant:

std::vector<cali::StringConverter> cali::StringConverter::rec_list(bool* okptr) const
{
    std::vector<StringConverter> ret;
    bool                         error = false;
    char                         c;

    std::istringstream is(m_str);

    int d = 0;
    c     = util::read_char(is);

    if (c == '[')
        ++d;
    else if (is.good())
        is.unget();

    do {
        c = util::read_char(is);
        std::string str;

        if (c == '{') {
            str = "{";
            str.append(util::read_nested_text(is, '{', '}'));

            c = util::read_char(is);
            if (c != '}') {
                error = true;
                break;
            }

            str.append("}");
        } else if (c == '[') {
            str = "[";
            str.append(util::read_nested_text(is, '[', ']'));

            c = util::read_char(is);
            if (c != ']') {
                error = true;
                break;
            }
            str.append("]");
        } else {
            is.unget();
            str = util::read_word(is, ",]");
        }

        if (!str.empty())
            ret.push_back(StringConverter(str));

        c = util::read_char(is);
    } while (is.good() && util::is_one_of(c, ","));

    if (d > 0) {
        if (c != ']')
            error = true;
    } else
        is.unget();

    if (okptr)
        *okptr = !error;

    return ret;
}